

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O0

void __thiscall
highwayhash::HighwayHashCatT<4U>::Finalize<unsigned_long>
          (HighwayHashCatT<4U> *this,unsigned_long *hash)

{
  long in_RDI;
  size_t buffer_usage;
  HHStateT<4U> state_copy;
  HHStateAVX2 *in_stack_000000b0;
  size_t in_stack_000000f0;
  char *in_stack_000000f8;
  HHStateAVX2 *in_stack_00000100;
  HHStateAVX2 local_c0;
  
  AVX2::HHStateAVX2::HHStateAVX2(&local_c0,(HHStateAVX2 *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + 0xa0) != 0) {
    AVX2::HHStateAVX2::UpdateRemainder(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  AVX2::HHStateAVX2::Finalize(in_stack_000000b0,(HHResult64 *)this);
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }